

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image *
rf_load_image_from_file_data
          (rf_image *__return_storage_ptr__,void *src,rf_int src_size,rf_allocator allocator,
          rf_allocator temp_allocator)

{
  rf_source_location rVar1;
  rf_source_location source_location;
  rf_source_location source_location_00;
  rf_source_location rVar2;
  rf_allocator_args rVar3;
  undefined1 auVar4 [24];
  int iVar5;
  int iVar6;
  stbi_uc *__src;
  void *__dest;
  rf_allocator_proc *prVar7;
  size_t __n;
  long in_FS_OFFSET;
  int channels;
  int height;
  int width;
  char *local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  stbi_uc *local_d0;
  undefined8 uStack_c8;
  undefined4 local_c0;
  uint uStack_bc;
  char *local_b8;
  char *pcStack_b0;
  undefined8 local_a8;
  char *local_a0;
  char *pcStack_98;
  undefined8 local_90;
  undefined8 local_88;
  size_t sStack_80;
  undefined4 local_78;
  uint uStack_74;
  char *local_70;
  char *pcStack_68;
  undefined8 local_60;
  rf_allocator allocator_local;
  
  prVar7 = allocator.allocator_proc;
  allocator_local.user_data = allocator.user_data;
  allocator_local.allocator_proc = prVar7;
  if (src == (void *)0x0 || src_size < 1) {
    rf_log_impl(8,0x172d65,(char *)0x1);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_load_image_from_file_data";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3c7b;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->width = 0;
    __return_storage_ptr__->height = 0;
    __return_storage_ptr__->format = 0;
    __return_storage_ptr__->valid = false;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  }
  else {
    __return_storage_ptr__->format = 0;
    __return_storage_ptr__->valid = false;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
    width = 0;
    height = 0;
    channels = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->width = 0;
    __return_storage_ptr__->height = 0;
    *(void **)(in_FS_OFFSET + -0x430) = temp_allocator.user_data;
    *(rf_allocator_proc **)(in_FS_OFFSET + -0x428) = temp_allocator.allocator_proc;
    __src = stbi_load_from_memory((stbi_uc *)src,(int)src_size,&width,&height,&channels,0);
    iVar6 = width;
    iVar5 = height;
    *(undefined8 *)(in_FS_OFFSET + -0x430) = 0;
    *(undefined8 *)(in_FS_OFFSET + -0x428) = 0;
    if (channels == 0 || __src == (stbi_uc *)0x0) {
      local_e8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_e0 = "rf_load_image_from_file_data";
      local_d8 = 0x3ca6;
      source_location.proc_name._0_4_ = 0x172d48;
      source_location.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      source_location.proc_name._4_4_ = 0;
      source_location.line_in_file = 0x3ca6;
      rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                  "File format not supported or could not be loaded. STB Image returned { x: %d, y: %d, channels: %d }"
                  ,7,(ulong)(uint)width,(ulong)(uint)height,(ulong)(uint)channels);
      *(char **)(in_FS_OFFSET + -0x450) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(in_FS_OFFSET + -0x448) = "rf_load_image_from_file_data";
      *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3ca6;
      *(undefined4 *)(in_FS_OFFSET + -0x438) = 7;
    }
    else {
      local_70 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_68 = "rf_load_image_from_file_data";
      local_60 = 0x3c8c;
      local_88 = 0;
      __n = (size_t)(channels * width * height);
      local_78 = 0;
      rVar1.proc_name._0_4_ = 0x172d48;
      rVar1.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar1.proc_name._4_4_ = 0;
      rVar1.line_in_file = 0x3c8c;
      auVar4._8_8_ = (ulong)uStack_74 << 0x20;
      auVar4._0_8_ = __n;
      auVar4._16_8_ = 0;
      sStack_80 = __n;
      __dest = (*prVar7)(&allocator_local,rVar1,RF_AM_ALLOC,(rf_allocator_args)(auVar4 << 0x40));
      if (__dest == (void *)0x0) {
        local_a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_98 = "rf_load_image_from_file_data";
        local_90 = 0x3ca1;
        source_location_00.proc_name._0_4_ = 0x172d48;
        source_location_00.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        source_location_00.proc_name._4_4_ = 0;
        source_location_00.line_in_file = 0x3ca1;
        rf_log_impl(source_location_00,RF_LOG_TYPE_ERROR,"Buffer is not big enough",2,
                    (ulong)(uint)iVar6,(ulong)(uint)iVar5,(ulong)(uint)channels);
        *(char **)(in_FS_OFFSET + -0x450) =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        *(char **)(in_FS_OFFSET + -0x448) = "rf_load_image_from_file_data";
        *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3ca1;
        *(undefined4 *)(in_FS_OFFSET + -0x438) = 2;
      }
      else {
        __return_storage_ptr__->data = __dest;
        __return_storage_ptr__->width = iVar6;
        __return_storage_ptr__->height = iVar5;
        __return_storage_ptr__->valid = true;
        if (channels - 1U < 4) {
          __return_storage_ptr__->format =
               *(rf_pixel_format *)(&DAT_00170080 + (ulong)(channels - 1U) * 4);
        }
        memcpy(__dest,__src,__n);
      }
      local_b8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_b0 = "rf_load_image_from_file_data";
      uStack_c8 = 0;
      local_a8 = 0x3ca4;
      local_c0 = 0;
      rVar2.proc_name._0_4_ = 0x172d48;
      rVar2.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar2.proc_name._4_4_ = 0;
      rVar2.line_in_file = 0x3ca4;
      rVar3.size_to_allocate_or_reallocate = 0;
      rVar3.pointer_to_free_or_realloc = __src;
      rVar3._16_8_ = (ulong)uStack_bc << 0x20;
      local_d0 = __src;
      (*temp_allocator.allocator_proc)(&temp_allocator,rVar2,RF_AM_FREE,rVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_load_image_from_file_data(const void* src, rf_int src_size, rf_allocator allocator, rf_allocator temp_allocator)
{
    // Preconditions
    if (!src || src_size <= 0)
    {
        RF_LOG_ERROR(RF_BAD_ARGUMENT, "Argument `src` was null.");
        return (rf_image) {0};
    }

    // Compute the result
    rf_image result = {0};

    // Use stb image with the `temp_allocator` to decompress the image and get it's data
    int width = 0, height = 0, channels = 0;
    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
    void* stbi_result = stbi_load_from_memory(src, src_size, &width, &height, &channels, RF_ANY_CHANNELS);
    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

    if (stbi_result && channels)
    {
        // Allocate a result buffer using the `allocator` and copy the data to it
        int stbi_result_size = width * height * channels;
        void* result_buffer = RF_ALLOC(allocator, stbi_result_size);

        if (result_buffer)
        {
            result.data   = result_buffer;
            result.width  = width;
            result.height = height;
            result.valid  = true;

            // Set the format appropriately depending on the `channels` count
            switch (channels)
            {
                case 1: result.format = RF_UNCOMPRESSED_GRAYSCALE; break;
                case 2: result.format = RF_UNCOMPRESSED_GRAY_ALPHA; break;
                case 3: result.format = RF_UNCOMPRESSED_R8G8B8; break;
                case 4: result.format = RF_UNCOMPRESSED_R8G8B8A8; break;
                default: break;
            }

            memcpy(result_buffer, stbi_result, stbi_result_size);
        }
        else RF_LOG_ERROR(RF_BAD_ALLOC, "Buffer is not big enough", width, height, channels);

        // Free the temp buffer allocated by stbi
        RF_FREE(temp_allocator, stbi_result);
    }
    else RF_LOG_ERROR(RF_STBI_FAILED, "File format not supported or could not be loaded. STB Image returned { x: %d, y: %d, channels: %d }", width, height, channels);

    return result;
}